

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

int32_t tinygltf::GetComponentSizeInBytes(uint32_t componentType)

{
  undefined4 local_c;
  uint32_t componentType_local;
  
  if (componentType == 0x1400) {
    local_c = 1;
  }
  else if (componentType == 0x1401) {
    local_c = 1;
  }
  else if (componentType == 0x1402) {
    local_c = 2;
  }
  else if (componentType == 0x1403) {
    local_c = 2;
  }
  else if (componentType == 0x1404) {
    local_c = 4;
  }
  else if (componentType == 0x1405) {
    local_c = 4;
  }
  else if (componentType == 0x1406) {
    local_c = 4;
  }
  else if (componentType == 0x140a) {
    local_c = 8;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

static inline int32_t GetComponentSizeInBytes(uint32_t componentType) {
  if (componentType == TINYGLTF_COMPONENT_TYPE_BYTE) {
    return 1;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_UNSIGNED_BYTE) {
    return 1;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_SHORT) {
    return 2;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_UNSIGNED_SHORT) {
    return 2;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_INT) {
    return 4;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_UNSIGNED_INT) {
    return 4;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_FLOAT) {
    return 4;
  } else if (componentType == TINYGLTF_COMPONENT_TYPE_DOUBLE) {
    return 8;
  } else {
    // Unknown componenty type
    return -1;
  }
}